

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sighashtype.cpp
# Opt level: O3

void __thiscall
SigHashType_SetFromSigHashFlag_Test::TestBody(SigHashType_SetFromSigHashFlag_Test *this)

{
  bool bVar1;
  internal iVar2;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  SigHashType type;
  AssertHelper local_58;
  AssertHelper local_50;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertHelper local_40;
  string local_38;
  SigHashType local_14;
  
  cfd::core::SigHashType::SigHashType(&local_14);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::SigHashType::SetFromSigHashFlag(&local_14,0x82);
    }
  }
  else {
    testing::Message::Message((Message *)&local_38);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_sighashtype.cpp"
               ,0x1e,
               "Expected: type.SetFromSigHashFlag(0x82) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_38._M_dataplus._M_p._1_7_,
                                       (char)local_38._M_dataplus._M_p) + 8))();
      }
    }
  }
  local_50.data_._0_4_ = cfd::core::SigHashType::GetSigHashAlgorithm(&local_14);
  local_58.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<cfd::core::SigHashAlgorithm,cfd::core::SigHashAlgorithm>
            ((internal *)&local_38,"type.GetSigHashAlgorithm()","SigHashAlgorithm::kSigHashNone",
             (SigHashAlgorithm *)&local_50,(SigHashAlgorithm *)&local_58);
  if ((char)local_38._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_50);
    if ((undefined8 *)local_38._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_38._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_sighashtype.cpp"
               ,0x1f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (CONCAT44(local_50.data_._4_4_,(SigHashAlgorithm)local_50.data_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_50.data_._4_4_,(SigHashAlgorithm)local_50.data_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_50.data_._4_4_,(SigHashAlgorithm)local_50.data_) + 8))
                  ();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  iVar2 = (internal)cfd::core::SigHashType::IsAnyoneCanPay(&local_14);
  local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_50.data_._0_1_ = iVar2;
  if (!(bool)iVar2) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,(internal *)&local_50,(AssertionResult *)"type.IsAnyoneCanPay()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_sighashtype.cpp"
               ,0x20,(char *)CONCAT71(local_38._M_dataplus._M_p._1_7_,
                                      (char)local_38._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p) !=
        &local_38.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p));
    }
    if (CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = cfd::core::SigHashType::IsForkId(&local_14);
  local_50.data_._0_4_ = CONCAT31(local_50.data_._1_3_,!bVar1);
  local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,(internal *)&local_50,(AssertionResult *)"type.IsForkId()","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_sighashtype.cpp"
               ,0x21,(char *)CONCAT71(local_38._M_dataplus._M_p._1_7_,
                                      (char)local_38._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p) !=
        &local_38.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p));
    }
    if (CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::SigHashType::SetFromSigHashFlag(&local_14,'A');
    }
  }
  else {
    testing::Message::Message((Message *)&local_38);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_sighashtype.cpp"
               ,0x23,
               "Expected: type.SetFromSigHashFlag(0x41) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_38._M_dataplus._M_p._1_7_,
                                       (char)local_38._M_dataplus._M_p) + 8))();
      }
    }
  }
  local_50.data_._0_4_ = cfd::core::SigHashType::GetSigHashAlgorithm(&local_14);
  local_58.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<cfd::core::SigHashAlgorithm,cfd::core::SigHashAlgorithm>
            ((internal *)&local_38,"type.GetSigHashAlgorithm()","SigHashAlgorithm::kSigHashAll",
             (SigHashAlgorithm *)&local_50,(SigHashAlgorithm *)&local_58);
  if ((char)local_38._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_50);
    if ((undefined8 *)local_38._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_38._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_sighashtype.cpp"
               ,0x24,pcVar3);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (CONCAT44(local_50.data_._4_4_,(SigHashAlgorithm)local_50.data_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_50.data_._4_4_,(SigHashAlgorithm)local_50.data_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_50.data_._4_4_,(SigHashAlgorithm)local_50.data_) + 8))
                  ();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = cfd::core::SigHashType::IsAnyoneCanPay(&local_14);
  iVar2 = (internal)!bVar1;
  local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_50.data_._0_1_ = iVar2;
  if (!(bool)iVar2) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,(internal *)&local_50,(AssertionResult *)"type.IsAnyoneCanPay()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_sighashtype.cpp"
               ,0x25,(char *)CONCAT71(local_38._M_dataplus._M_p._1_7_,
                                      (char)local_38._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p) !=
        &local_38.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p));
    }
    if (CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = cfd::core::SigHashType::IsForkId(&local_14);
  local_50.data_._0_4_ = CONCAT31(local_50.data_._1_3_,bVar1);
  local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,(internal *)&local_50,(AssertionResult *)"type.IsForkId()","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_sighashtype.cpp"
               ,0x26,(char *)CONCAT71(local_38._M_dataplus._M_p._1_7_,
                                      (char)local_38._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p) !=
        &local_38.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p));
    }
    if (CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::SigHashType::SetFromSigHashFlag(&local_14,'\x03');
    }
  }
  else {
    testing::Message::Message((Message *)&local_38);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_sighashtype.cpp"
               ,0x28,
               "Expected: type.SetFromSigHashFlag(0x03) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_38._M_dataplus._M_p._1_7_,
                                       (char)local_38._M_dataplus._M_p) + 8))();
      }
    }
  }
  local_50.data_._0_4_ = cfd::core::SigHashType::GetSigHashAlgorithm(&local_14);
  local_58.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<cfd::core::SigHashAlgorithm,cfd::core::SigHashAlgorithm>
            ((internal *)&local_38,"type.GetSigHashAlgorithm()","SigHashAlgorithm::kSigHashSingle",
             (SigHashAlgorithm *)&local_50,(SigHashAlgorithm *)&local_58);
  if ((char)local_38._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_50);
    if ((undefined8 *)local_38._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_38._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_sighashtype.cpp"
               ,0x29,pcVar3);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (CONCAT44(local_50.data_._4_4_,(SigHashAlgorithm)local_50.data_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_50.data_._4_4_,(SigHashAlgorithm)local_50.data_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_50.data_._4_4_,(SigHashAlgorithm)local_50.data_) + 8))
                  ();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = cfd::core::SigHashType::IsAnyoneCanPay(&local_14);
  iVar2 = (internal)!bVar1;
  local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_50.data_._0_1_ = iVar2;
  if (!(bool)iVar2) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,(internal *)&local_50,(AssertionResult *)"type.IsAnyoneCanPay()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_sighashtype.cpp"
               ,0x2a,(char *)CONCAT71(local_38._M_dataplus._M_p._1_7_,
                                      (char)local_38._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p) !=
        &local_38.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p));
    }
    if (CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = cfd::core::SigHashType::IsForkId(&local_14);
  local_50.data_._0_4_ = CONCAT31(local_50.data_._1_3_,!bVar1);
  local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,(internal *)&local_50,(AssertionResult *)"type.IsForkId()","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_sighashtype.cpp"
               ,0x2b,(char *)CONCAT71(local_38._M_dataplus._M_p._1_7_,
                                      (char)local_38._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p) !=
        &local_38.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p));
    }
    if (CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(SigHashType, SetFromSigHashFlag) {
  SigHashType type;
  EXPECT_NO_THROW(type.SetFromSigHashFlag(0x82));
  EXPECT_EQ(type.GetSigHashAlgorithm(), SigHashAlgorithm::kSigHashNone);
  EXPECT_TRUE(type.IsAnyoneCanPay());
  EXPECT_FALSE(type.IsForkId());

  EXPECT_NO_THROW(type.SetFromSigHashFlag(0x41));
  EXPECT_EQ(type.GetSigHashAlgorithm(), SigHashAlgorithm::kSigHashAll);
  EXPECT_FALSE(type.IsAnyoneCanPay());
  EXPECT_TRUE(type.IsForkId());

  EXPECT_NO_THROW(type.SetFromSigHashFlag(0x03));
  EXPECT_EQ(type.GetSigHashAlgorithm(), SigHashAlgorithm::kSigHashSingle);
  EXPECT_FALSE(type.IsAnyoneCanPay());
  EXPECT_FALSE(type.IsForkId());
}